

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

cmInstallRuntimeDependencySet * __thiscall
cmGlobalGenerator::GetNamedRuntimeDependencySet(cmGlobalGenerator *this,string *name)

{
  iterator iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>_>,_bool>
  pVar2;
  __single_object set;
  undefined1 local_50 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>
  local_48;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>_>_>
          ::find(&(this->RuntimeDependencySetsByName)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->RuntimeDependencySetsByName)._M_t._M_impl.super__Rb_tree_header) {
    std::make_unique<cmInstallRuntimeDependencySet,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::__cxx11::string::string((string *)(local_50 + 8),(string *)name);
    local_48.second = (cmInstallRuntimeDependencySet *)local_50;
    pVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,cmInstallRuntimeDependencySet*>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>>>
                        *)&this->RuntimeDependencySetsByName,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>
                        *)(local_50 + 8));
    iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
    std::__cxx11::string::~string((string *)(local_50 + 8));
    std::
    vector<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>,std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>>>
    ::
    emplace_back<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>>
              ((vector<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>,std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>>>
                *)&this->RuntimeDependencySets,
               (unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
                *)local_50);
    std::
    unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>::
    ~unique_ptr((unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
                 *)local_50);
  }
  return *(cmInstallRuntimeDependencySet **)(iVar1._M_node + 2);
}

Assistant:

cmInstallRuntimeDependencySet* cmGlobalGenerator::GetNamedRuntimeDependencySet(
  const std::string& name)
{
  auto it = this->RuntimeDependencySetsByName.find(name);
  if (it == this->RuntimeDependencySetsByName.end()) {
    auto set = cm::make_unique<cmInstallRuntimeDependencySet>(name);
    it =
      this->RuntimeDependencySetsByName.insert(std::make_pair(name, set.get()))
        .first;
    this->RuntimeDependencySets.push_back(std::move(set));
  }
  return it->second;
}